

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_symmetr.c
# Opt level: O0

void pnga_symmetrize(Integer g_a)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Integer *ndim_00;
  Integer IVar4;
  logical lVar5;
  Integer in_RDI;
  DoublePrecision half;
  char *tempB;
  int local_sync_end;
  int local_sync_begin;
  void *b_ptr;
  void *a_ptr;
  Integer num_blocks_a;
  Integer g_b;
  Logical have_data;
  Integer type;
  Integer dims [7];
  Integer ndim;
  Integer ldb [7];
  Integer *in_stack_000000d8;
  Integer bhi [7];
  Integer in_stack_00000118;
  Integer blo [7];
  Integer nelem;
  Integer lda [7];
  Integer ahi [7];
  Integer alo [7];
  Integer me;
  Integer i;
  DoublePrecision alpha;
  Integer in_stack_00000288;
  Integer in_stack_00000290;
  char *in_stack_fffffffffffffdd0;
  uint in_stack_fffffffffffffddc;
  uint uVar6;
  Integer in_stack_fffffffffffffde0;
  char *g_a_00;
  void *local_208;
  long local_1e0;
  long local_1d8 [7];
  long local_1a0;
  long local_198 [8];
  long local_158 [8];
  Integer local_118 [7];
  long local_e0;
  long in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  Integer *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  Integer *in_stack_ffffffffffffff90;
  Integer *in_stack_ffffffffffffff98;
  Integer in_stack_ffffffffffffffa0;
  Integer local_58 [6];
  Integer *in_stack_ffffffffffffffd8;
  Integer *in_stack_ffffffffffffffe8;
  long lVar7;
  DoublePrecision alpha_00;
  
  alpha_00 = 0.5;
  ndim_00 = (Integer *)pnga_nodeid();
  iVar2 = _ga_sync_end;
  iVar1 = _ga_sync_begin;
  local_e0 = 1;
  local_208 = (void *)0x0;
  g_a_00 = "A_transpose";
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar1 != 0) {
    pnga_sync();
  }
  IVar4 = pnga_total_blocks(in_RDI);
  pnga_inquire((Integer)alpha_00,in_stack_ffffffffffffffe8,ndim_00,in_stack_ffffffffffffffd8);
  if (local_1e0 != 0x3ec) {
    pnga_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  if (IVar4 < 0) {
    if (local_1d8[local_1a0 + -1] != local_1d8[local_1a0 + -2]) {
      pnga_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    pnga_distribution(bhi[2],bhi[1],(Integer *)bhi[0],in_stack_000000d8);
    uVar3 = (uint)(0 < in_stack_ffffffffffffff68);
    for (lVar7 = 1; lVar7 < local_1a0; lVar7 = lVar7 + 1) {
      uVar6 = in_stack_fffffffffffffddc & 0xffffff;
      if (uVar3 != 0) {
        uVar6 = CONCAT13(0 < *(long *)(&stack0xffffffffffffff68 + lVar7 * 8),
                         (int3)in_stack_fffffffffffffddc);
      }
      uVar3 = uVar6 >> 0x18;
      in_stack_fffffffffffffddc = uVar6;
    }
    if (uVar3 != 0) {
      pnga_access_ptr(ahi[6],(Integer *)ahi[5],(Integer *)ahi[4],(void *)ahi[3],(Integer *)ahi[2]);
      for (lVar7 = 0; lVar7 < local_1a0; lVar7 = lVar7 + 1) {
        local_e0 = ((*(long *)(&stack0xffffffffffffff68 + lVar7 * 8) - local_58[lVar7]) + 1) *
                   local_e0;
      }
      local_208 = pnga_malloc(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,
                              in_stack_fffffffffffffdd0);
      for (lVar7 = 0; lVar7 < local_1a0 + -2; lVar7 = lVar7 + 1) {
        local_158[lVar7] = *(long *)(&stack0xffffffffffffff68 + lVar7 * 8);
        local_118[lVar7] = local_58[lVar7];
      }
      local_118[local_1a0 + -1] = local_58[local_1a0 + -2];
      local_158[local_1a0 + -1] = *(long *)(&stack0xffffffffffffff68 + (local_1a0 + -2) * 8);
      local_118[local_1a0 + -2] = local_58[local_1a0 + -1];
      local_158[local_1a0 + -2] = *(long *)(&stack0xffffffffffffff68 + (local_1a0 + -1) * 8);
      for (lVar7 = 0; lVar7 < local_1a0 + -1; lVar7 = lVar7 + 1) {
        local_198[lVar7] = (local_158[lVar7] - local_118[lVar7]) + 1;
      }
      pnga_get(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    pnga_sync();
    if (uVar3 != 0) {
      gai_add(local_58,(Integer *)&stack0xffffffffffffff68,(void *)0x0,local_208,alpha_00,local_1e0,
              local_e0,local_1a0);
      pnga_release_update(in_RDI,local_58,(Integer *)&stack0xffffffffffffff68);
      pnga_free((void *)0x1c9f56);
    }
  }
  else {
    lVar5 = pnga_duplicate(type,(Integer *)have_data,(char *)g_b);
    if (lVar5 == 0) {
      pnga_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    pnga_transpose(in_stack_00000290,in_stack_00000288);
    pnga_add((void *)blo[3],blo[2],(void *)blo[1],blo[0],in_stack_00000118);
    pnga_destroy((Integer)g_a_00);
  }
  if (iVar2 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_symmetrize(Integer g_a) {
  
  DoublePrecision alpha = 0.5;
  Integer i, me = pnga_nodeid();
  Integer alo[GA_MAX_DIM], ahi[GA_MAX_DIM], lda[GA_MAX_DIM], nelem=1;
  Integer blo[GA_MAX_DIM], bhi[GA_MAX_DIM], ldb[GA_MAX_DIM];
  Integer ndim, dims[GA_MAX_DIM], type;
  Logical have_data;
  Integer g_b; /* temporary global array (b = A') */
  Integer num_blocks_a;
  void *a_ptr=NULL, *b_ptr=NULL;
  int local_sync_begin,local_sync_end;
  char *tempB = "A_transpose";

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  
  num_blocks_a = pnga_total_blocks(g_a);

  pnga_inquire(g_a, &type, &ndim, dims);

  if (type != C_DBL)
    pnga_error("ga_symmetrize: only implemented for double precision",0);

  if (num_blocks_a < 0) {

    if (dims[ndim-1] != dims[ndim-2]) 
      pnga_error("ga_sym: can only sym square matrix", 0L);

    /* Find the local distribution */
    pnga_distribution(g_a, me, alo, ahi);


    have_data = ahi[0]>0;
    for(i=1; i<ndim; i++) have_data = have_data && ahi[i]>0;

    if(have_data) {
      pnga_access_ptr(g_a, alo, ahi, &a_ptr, lda); 

      for(i=0; i<ndim; i++) nelem *= ahi[i]-alo[i] +1;
      b_ptr = (void *) pnga_malloc(nelem, MT_F_DBL, "v");

      for(i=0; i<ndim-2; i++) {bhi[i]=ahi[i]; blo[i]=alo[i]; }

      /* switch rows and cols */
      blo[ndim-1]=alo[ndim-2];
      bhi[ndim-1]=ahi[ndim-2];
      blo[ndim-2]=alo[ndim-1];
      bhi[ndim-2]=ahi[ndim-1];

      for (i=0; i < ndim-1; i++) 
        ldb[i] = bhi[i] - blo[i] + 1; 
      pnga_get(g_a, blo, bhi, b_ptr, ldb);
    }
    pnga_sync(); 

    if(have_data) {
      gai_add(alo, ahi, a_ptr, b_ptr, alpha, type, nelem, ndim);
      pnga_release_update(g_a, alo, ahi);
      pnga_free(b_ptr);
    }
  } else {
    /* For block-cyclic data, probably most efficient solution is to
       create duplicate copy, transpose it and add the results together */
    DoublePrecision half = 0.5;
    if (!pnga_duplicate(g_a, &g_b, tempB))
      pnga_error("ga_symmetrize: duplicate failed", 0L);
    pnga_transpose(g_a, g_b);
    pnga_add(&half, g_a, &half, g_b, g_a);
    pnga_destroy(g_b);
  }
  if(local_sync_end)pnga_sync();
}